

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void sexp_push_utf8_char(sexp ctx,int i,sexp port)

{
  byte bVar1;
  long lVar2;
  long in_RDX;
  int in_ESI;
  int len;
  uchar ch [6];
  int local_24;
  byte local_1e [6];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_24 = sexp_utf8_char_byte_count(in_ESI);
  sexp_utf8_encode_char(local_1e,local_24,local_c);
  if (*(long *)(local_18 + 0x20) == 0) {
    while (0 < local_24) {
      local_24 = local_24 + -1;
      bVar1 = local_1e[local_24];
      lVar2 = *(long *)(local_18 + 0x38);
      *(long *)(local_18 + 0x38) = lVar2 + -1;
      *(byte *)(*(long *)(local_18 + 0x28) + -1 + lVar2) = bVar1;
    }
  }
  else {
    while (0 < local_24) {
      local_24 = local_24 + -1;
      ungetc((uint)local_1e[local_24],*(FILE **)(local_18 + 0x20));
    }
  }
  return;
}

Assistant:

void sexp_push_utf8_char (sexp ctx, int i, sexp port) {
  unsigned char ch[6];
  int len = sexp_utf8_char_byte_count(i);
  sexp_utf8_encode_char(ch, len, i);
  if (sexp_port_stream(port))  {
    while (len>0)
      ungetc(ch[--len], sexp_port_stream(port));
  } else {
    while (len>0)
      sexp_port_buf(port)[--sexp_port_offset(port)] = ch[--len];
  }
}